

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void convert_samples_short
               (int buf_c,short **buffer,int b_offset,int data_c,float **data,int d_offset,
               int samples)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int limit;
  int i;
  int in_stack_00000060;
  int in_stack_00000064;
  float **in_stack_00000068;
  int in_stack_00000074;
  short *in_stack_00000078;
  int in_stack_00000084;
  int local_30;
  int local_28;
  
  if (((in_EDI == in_ECX) || (2 < in_EDI)) || (6 < in_ECX)) {
    local_30 = in_ECX;
    if (in_EDI < in_ECX) {
      local_30 = in_EDI;
    }
    for (local_28 = 0; local_28 < local_30; local_28 = local_28 + 1) {
      copy_samples((short *)(*(long *)(in_RSI + (long)local_28 * 8) + (long)in_EDX * 2),
                   (float *)(*(long *)(in_R8 + (long)local_28 * 8) + (long)in_R9D * 4),
                   in_stack_00000008);
    }
    for (; local_28 < in_EDI; local_28 = local_28 + 1) {
      memset((void *)(*(long *)(in_RSI + (long)local_28 * 8) + (long)in_EDX * 2),0,
             (long)in_stack_00000008 << 1);
    }
  }
  else {
    for (local_28 = 0; local_28 < in_EDI; local_28 = local_28 + 1) {
      compute_samples(in_stack_00000084,in_stack_00000078,in_stack_00000074,in_stack_00000068,
                      in_stack_00000064,in_stack_00000060);
    }
  }
  return;
}

Assistant:

static void convert_samples_short(int buf_c, short **buffer, int b_offset, int data_c, float **data, int d_offset, int samples)
{
   int i;
   if (buf_c != data_c && buf_c <= 2 && data_c <= 6) {
      static int channel_selector[3][2] = { {0}, {PLAYBACK_MONO}, {PLAYBACK_LEFT, PLAYBACK_RIGHT} };
      for (i=0; i < buf_c; ++i)
         compute_samples(channel_selector[buf_c][i], buffer[i]+b_offset, data_c, data, d_offset, samples);
   } else {
      int limit = buf_c < data_c ? buf_c : data_c;
      for (i=0; i < limit; ++i)
         copy_samples(buffer[i]+b_offset, data[i]+d_offset, samples);
      for (   ; i < buf_c; ++i)
         memset(buffer[i]+b_offset, 0, sizeof(short) * samples);
   }
}